

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsImplicitLod(Op opcode)

{
  bool local_9;
  Op opcode_local;
  
  if (((((opcode == OpImageSampleImplicitLod) || (opcode == OpImageSampleDrefImplicitLod)) ||
       (opcode == OpImageSampleProjImplicitLod)) ||
      ((opcode == OpImageSampleProjDrefImplicitLod || (opcode == OpImageSparseSampleImplicitLod))))
     || ((opcode == OpImageSparseSampleDrefImplicitLod ||
         ((opcode == OpImageSparseSampleProjImplicitLod ||
          (opcode == OpImageSparseSampleProjDrefImplicitLod)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool IsImplicitLod(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpImageSampleImplicitLod:
    case spv::Op::OpImageSampleDrefImplicitLod:
    case spv::Op::OpImageSampleProjImplicitLod:
    case spv::Op::OpImageSampleProjDrefImplicitLod:
    case spv::Op::OpImageSparseSampleImplicitLod:
    case spv::Op::OpImageSparseSampleDrefImplicitLod:
    case spv::Op::OpImageSparseSampleProjImplicitLod:
    case spv::Op::OpImageSparseSampleProjDrefImplicitLod:
      return true;
    default:
      break;
  }
  return false;
}